

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O3

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,StringPtr bindAddress,uint defaultPort,
          ReaderOptions readerOpts)

{
  _Rb_tree_header *p_Var1;
  Disposer *pDVar2;
  ForkHub<unsigned_int> *pFVar3;
  ClientHook *pCVar4;
  undefined8 uVar5;
  PromiseNode *pPVar6;
  long *plVar7;
  int iVar8;
  undefined4 extraout_var;
  PromiseFulfillerPair<unsigned_int> paf;
  undefined1 local_a8 [16];
  Promise<void> local_98;
  PromiseFulfiller<unsigned_int> *local_88;
  long *local_80;
  undefined8 *local_78;
  long *plStack_70;
  Promise<unsigned_int> local_68;
  int local_58;
  undefined8 *local_50;
  long *plStack_48;
  Own<kj::_::PromiseNode> local_38;
  
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00623f80;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00623fa8;
  pCVar4 = (mainInterface->hook).ptr;
  (this->mainInterface).hook.disposer = (mainInterface->hook).disposer;
  (this->mainInterface).hook.ptr = pCVar4;
  (mainInterface->hook).ptr = (ClientHook *)0x0;
  EzRpcContext::getThreadLocal();
  p_Var1 = &(this->exportMap)._M_t._M_impl.super__Rb_tree_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->portPromise).hub.disposer = (Disposer *)0x0;
  (this->portPromise).hub.ptr = (ForkHub<unsigned_int> *)0x0;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  kj::newPromiseAndFulfiller<unsigned_int>();
  kj::Promise<unsigned_int>::fork(&local_68);
  pDVar2 = (this->portPromise).hub.disposer;
  pFVar3 = (this->portPromise).hub.ptr;
  *(undefined4 *)&(this->portPromise).hub.disposer = local_68.super_PromiseBase.node.disposer._0_4_;
  *(undefined4 *)((long)&(this->portPromise).hub.disposer + 4) =
       local_68.super_PromiseBase.node.disposer._4_4_;
  *(undefined4 *)&(this->portPromise).hub.ptr = local_68.super_PromiseBase.node.ptr._0_4_;
  *(undefined4 *)((long)&(this->portPromise).hub.ptr + 4) =
       local_68.super_PromiseBase.node.ptr._4_4_;
  local_68.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (pFVar3 != (ForkHub<unsigned_int> *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar3->super_ForkHubBase).super_Refcounted.super_Disposer.
                              _vptr_Disposer +
                      (long)(pFVar3->super_ForkHubBase).super_Refcounted.super_Disposer.
                            _vptr_Disposer[-2]));
    pPVar6 = local_68.super_PromiseBase.node.ptr;
    if (local_68.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_68.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_68.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_68.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]));
    }
  }
  iVar8 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar8))
            (local_a8,(undefined8 *)CONCAT44(extraout_var,iVar8),bindAddress.content.ptr,
             bindAddress.content.size_,defaultPort);
  local_58 = readerOpts.nestingLimit;
  local_68.super_PromiseBase.node.ptr = (PromiseNode *)readerOpts.traversalLimitInWords;
  local_50 = local_78;
  plStack_48 = plStack_70;
  plStack_70 = (long *)0x0;
  local_68.super_PromiseBase.node.disposer = (Disposer *)this;
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::NetworkAddress>,kj::CaptureByMove<capnp::EzRpcServer::Impl::Impl(capnp::Capability::Client,kj::StringPtr,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::PromiseFulfiller<unsigned_int>>&&,kj::Own<kj::NetworkAddress>&&)_1_,kj::Own<kj::PromiseFulfiller<unsigned_int>>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::EzRpcServer::Impl::Impl(capnp::Capability::Client,kj::StringPtr,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::PromiseFulfiller<unsigned_int>>&&,kj::Own<kj::NetworkAddress>&&)_1_,kj::Own<kj::PromiseFulfiller<unsigned_int>>>,kj::_::PropagateException>
            (&local_38,
             (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_ez_rpc_c__:264:11),_kj::Own<kj::PromiseFulfiller<unsigned_int>_>_>
              *)local_a8,(PropagateException *)&local_68);
  local_98.super_PromiseBase.node.disposer = local_38.disposer;
  local_98.super_PromiseBase.node.ptr = local_38.ptr;
  kj::TaskSet::add(&this->tasks,&local_98);
  pPVar6 = local_98.super_PromiseBase.node.ptr;
  if ((Disposer *)local_98.super_PromiseBase.node.ptr != (Disposer *)0x0) {
    local_98.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_98.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_98.super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2])
              );
  }
  plVar7 = plStack_48;
  if (plStack_48 != (long *)0x0) {
    plStack_48 = (long *)0x0;
    (**(code **)*local_50)(local_50,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  uVar5 = local_a8._8_8_;
  if ((long *)local_a8._8_8_ != (long *)0x0) {
    local_a8._8_8_ = (long *)0x0;
    (**(((SturdyRefRestorer<capnp::AnyPointer> *)local_a8._0_8_)->super_SturdyRefRestorerBase).
       _vptr_SturdyRefRestorerBase)(local_a8._0_8_,uVar5 + *(long *)(*(long *)uVar5 + -0x10));
  }
  plVar7 = plStack_70;
  if (plStack_70 != (long *)0x0) {
    plStack_70 = (long *)0x0;
    (**(code **)*local_78)(local_78,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  plVar7 = local_80;
  if (local_80 != (long *)0x0) {
    local_80 = (long *)0x0;
    (**local_88->_vptr_PromiseFulfiller)(local_88,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  return;
}

Assistant:

Impl(Capability::Client mainInterface, kj::StringPtr bindAddress, uint defaultPort,
       ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()), portPromise(nullptr), tasks(*this) {
    auto paf = kj::newPromiseAndFulfiller<uint>();
    portPromise = paf.promise.fork();

    tasks.add(context->getIoProvider().getNetwork().parseAddress(bindAddress, defaultPort)
        .then(kj::mvCapture(paf.fulfiller,
          [this, readerOpts](kj::Own<kj::PromiseFulfiller<uint>>&& portFulfiller,
                             kj::Own<kj::NetworkAddress>&& addr) {
      auto listener = addr->listen();
      portFulfiller->fulfill(listener->getPort());
      acceptLoop(kj::mv(listener), readerOpts);
    })));
  }